

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void write_nal_unit_header_svc_extension(nal_svc_ext_t *nal_svc_ext,bs_t *b)

{
  _Bool _Var1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  
  _Var1 = nal_svc_ext->idr_flag;
  iVar4 = b->bits_left + -1;
  b->bits_left = iVar4;
  pbVar3 = b->p;
  if (pbVar3 < b->end) {
    *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | _Var1 << ((byte)b->bits_left & 0x1f);
  }
  if (b->bits_left == 0) {
    b->p = b->p + 1;
    b->bits_left = 8;
  }
  bVar2 = nal_svc_ext->priority_id;
  uVar5 = 5;
  do {
    iVar4 = b->bits_left + -1;
    b->bits_left = iVar4;
    pbVar3 = b->p;
    if (pbVar3 < b->end) {
      *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
      *b->p = *b->p | ((bVar2 >> (uVar5 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    bVar6 = uVar5 != 0;
    uVar5 = uVar5 - 1;
  } while (bVar6);
  _Var1 = nal_svc_ext->no_inter_layer_pred_flag;
  iVar4 = b->bits_left + -1;
  b->bits_left = iVar4;
  pbVar3 = b->p;
  if (pbVar3 < b->end) {
    *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | _Var1 << ((byte)b->bits_left & 0x1f);
  }
  if (b->bits_left == 0) {
    b->p = b->p + 1;
    b->bits_left = 8;
  }
  bVar2 = nal_svc_ext->dependency_id;
  uVar5 = 2;
  do {
    iVar4 = b->bits_left + -1;
    b->bits_left = iVar4;
    pbVar3 = b->p;
    if (pbVar3 < b->end) {
      *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
      *b->p = *b->p | ((bVar2 >> (uVar5 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    bVar6 = uVar5 != 0;
    uVar5 = uVar5 - 1;
  } while (bVar6);
  bVar2 = nal_svc_ext->quality_id;
  uVar5 = 3;
  do {
    iVar4 = b->bits_left + -1;
    b->bits_left = iVar4;
    pbVar3 = b->p;
    if (pbVar3 < b->end) {
      *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
      *b->p = *b->p | ((bVar2 >> (uVar5 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    bVar6 = uVar5 != 0;
    uVar5 = uVar5 - 1;
  } while (bVar6);
  bVar2 = nal_svc_ext->temporal_id;
  uVar5 = 2;
  do {
    iVar4 = b->bits_left + -1;
    b->bits_left = iVar4;
    pbVar3 = b->p;
    if (pbVar3 < b->end) {
      *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
      *b->p = *b->p | ((bVar2 >> (uVar5 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    bVar6 = uVar5 != 0;
    uVar5 = uVar5 - 1;
  } while (bVar6);
  _Var1 = nal_svc_ext->use_ref_base_pic_flag;
  iVar4 = b->bits_left + -1;
  b->bits_left = iVar4;
  pbVar3 = b->p;
  if (pbVar3 < b->end) {
    *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | _Var1 << ((byte)b->bits_left & 0x1f);
  }
  if (b->bits_left == 0) {
    b->p = b->p + 1;
    b->bits_left = 8;
  }
  _Var1 = nal_svc_ext->discardable_flag;
  iVar4 = b->bits_left + -1;
  b->bits_left = iVar4;
  pbVar3 = b->p;
  if (pbVar3 < b->end) {
    *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | _Var1 << ((byte)b->bits_left & 0x1f);
  }
  if (b->bits_left == 0) {
    b->p = b->p + 1;
    b->bits_left = 8;
  }
  _Var1 = nal_svc_ext->output_flag;
  iVar4 = b->bits_left + -1;
  b->bits_left = iVar4;
  pbVar3 = b->p;
  if (pbVar3 < b->end) {
    *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | _Var1 << ((byte)b->bits_left & 0x1f);
  }
  if (b->bits_left == 0) {
    b->p = b->p + 1;
    b->bits_left = 8;
  }
  bVar2 = nal_svc_ext->reserved_three_2bits;
  uVar5 = 1;
  do {
    iVar4 = b->bits_left + -1;
    b->bits_left = iVar4;
    pbVar3 = b->p;
    if (pbVar3 < b->end) {
      *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
      *b->p = *b->p | ((bVar2 >> (uVar5 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    bVar6 = uVar5 != 0;
    uVar5 = uVar5 - 1;
  } while (bVar6);
  return;
}

Assistant:

void write_nal_unit_header_svc_extension(nal_svc_ext_t* nal_svc_ext, bs_t* b)
{
    bs_write_u1(b, nal_svc_ext->idr_flag);
    bs_write_u(b, 6, nal_svc_ext->priority_id);
    bs_write_u1(b, nal_svc_ext->no_inter_layer_pred_flag);
    bs_write_u(b, 3, nal_svc_ext->dependency_id);
    bs_write_u(b, 4, nal_svc_ext->quality_id);
    bs_write_u(b, 3, nal_svc_ext->temporal_id);
    bs_write_u1(b, nal_svc_ext->use_ref_base_pic_flag);
    bs_write_u1(b, nal_svc_ext->discardable_flag);
    bs_write_u1(b, nal_svc_ext->output_flag);
    bs_write_u(b, 2, nal_svc_ext->reserved_three_2bits);
}